

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,Type tp)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000020;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *coWeights;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *weights;
  int weightSize;
  int coWeightSize;
  int i;
  double in_stack_00000070;
  cpp_dec_float<200U,_int,_void> *in_stack_00000078;
  undefined8 in_stack_ffffffffffffff58;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff60;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  long local_70;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_68;
  int local_60;
  int local_5c;
  int local_58;
  undefined8 *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined8 *local_8;
  
  local_5c = 0;
  local_60 = 0;
  local_68 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)(*(long *)(in_RDI + 0x10) + 0x1448);
  lVar1 = *(long *)(in_RDI + 0x10) + 0x1460;
  local_70 = lVar1;
  if (in_ESI == -1) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x768b9c);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
    local_58 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x768bb8);
    while (local_58 = local_58 + -1, local_5c <= local_58) {
      local_78 = 0x4000000000000000;
      local_10 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[](in_stack_ffffffffffffff60,
                              (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_18 = &local_78;
      local_8 = local_18;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_00000078,in_stack_00000070);
    }
    this_00 = local_68;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x768c48);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
    local_58 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x768c64);
    while (local_58 = local_58 + -1, local_60 <= local_58) {
      local_80 = 0x4000000000000000;
      local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[](this_00,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_30 = &local_80;
      local_20 = local_30;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_00000078,in_stack_00000070);
    }
  }
  else {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x768cf2);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
    local_58 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x768d0d);
    while (local_58 = local_58 + -1, local_5c <= local_58) {
      local_88 = 0x3ff0000000000000;
      local_40 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[](in_stack_ffffffffffffff60,(int)((ulong)lVar1 >> 0x20));
      local_48 = &local_88;
      local_38 = local_48;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_00000078,in_stack_00000070);
    }
  }
  *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0x1478) = 1;
  return;
}

Assistant:

void SPxDevexPR<R>::setupWeights(typename SPxSolverBase<R>::Type tp)
{
   int i;
   int coWeightSize = 0;
   int weightSize = 0;

   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(tp == SPxSolverBase<R>::ENTER)
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 2.0;

      weights.reDim(this->thesolver->coDim(), false);

      for(i = this->thesolver->coDim() - 1; i >= weightSize; --i)
         weights[i] = 2.0;
   }
   else
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 1.0;
   }

   this->thesolver->weightsAreSetup = true;
}